

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall
gss::innards::Proof::new_incumbent
          (Proof *this,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *solution)

{
  undefined1 auVar1 [16];
  pointer ppVar2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var4;
  pointer ppVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  long lVar8;
  type *v;
  pointer ppVar9;
  pointer ppVar10;
  char *pcVar11;
  undefined1 local_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"soli",4);
  ppVar2 = (solution->
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (ppVar9 = (solution->
                super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
    uVar3._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl," ",1);
    pcVar11 = "~";
    if ((ulong)ppVar9->second != 0) {
      pcVar11 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,pcVar11,(ulong)ppVar9->second ^ 1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,"x",1);
    local_48._0_8_ = (long)ppVar9->first;
    pmVar6 = std::
             map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->binary_variable_mappings,(key_type_conflict1 *)local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
  }
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  ppVar5 = *(pointer *)((long)&(_Var4._M_head_impl)->zero_in_proof_objectives + 8);
  for (ppVar10 = *(pointer *)
                  &((_Var4._M_head_impl)->zero_in_proof_objectives).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
      ppVar10 != ppVar5; ppVar10 = ppVar10 + 1) {
    uVar3._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl," ~",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,"x",1);
    auVar1._8_8_ = 0;
    auVar1._0_4_ = ppVar10->first;
    auVar1._4_4_ = ppVar10->second;
    local_48._0_16_ = vpmovsxdq_avx(auVar1);
    pmVar7 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
  }
  local_48[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,local_48,1);
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  lVar8 = (_Var4._M_head_impl)->proof_line + 1;
  (_Var4._M_head_impl)->proof_line = lVar8;
  (_Var4._M_head_impl)->objective_line = lVar8;
  return;
}

Assistant:

auto Proof::new_incumbent(const vector<pair<int, bool>> & solution) -> void
{
    *_imp->proof_stream << "soli";
    for (auto & [v, t] : solution)
        *_imp->proof_stream << " " << (t ? "" : "~") << "x" << _imp->binary_variable_mappings[v];
    for (auto & [v, w] : _imp->zero_in_proof_objectives)
        *_imp->proof_stream << " ~"
                            << "x" << _imp->variable_mappings[pair{v, w}];
    *_imp->proof_stream << '\n';
    _imp->objective_line = ++_imp->proof_line;
}